

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Header6.cpp
# Opt level: O2

void __thiscall KDIS::PDU::Header6::Decode(Header6 *this,KDataStream *stream,bool ignoreHeader)

{
  long lVar1;
  KUINT16 KVar2;
  KUINT16 KVar3;
  ostream *poVar4;
  KException *this_00;
  undefined7 in_register_00000011;
  ulong uVar5;
  allocator<char> local_1f9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  KString local_1d8;
  KStringStream ss;
  ostream local_1a8 [376];
  
  if ((int)CONCAT71(in_register_00000011,ignoreHeader) != 0) {
    return;
  }
  KVar2 = KDataStream::GetBufferSize(stream);
  if (0xb < KVar2) {
    KDataStream::Read(stream,&this->m_ui8ProtocolVersion);
    KDataStream::Read(stream,&this->m_ui8ExerciseID);
    KDataStream::Read(stream,&this->m_ui8PDUType);
    KDataStream::Read(stream,&this->m_ui8ProtocolFamily);
    (*(this->m_TimeStamp).super_DataTypeBase._vptr_DataTypeBase[3])(&this->m_TimeStamp,stream);
    KDataStream::Read<unsigned_short>(stream,&this->m_ui16PDULength);
    KDataStream::Read(stream,&this->m_ui8Padding1);
    KDataStream::Read(stream,&this->m_ui8Padding2);
    return;
  }
  KVar2 = KDataStream::GetBufferSize(stream);
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  poVar4 = std::operator<<(local_1a8,"Received ");
  KVar3 = KDataStream::GetBufferSize(stream);
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,KVar3);
  poVar4 = std::operator<<(poVar4," bytes. Expected minimum ");
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  std::operator<<(poVar4," bytes.\nData: ");
  for (uVar5 = 0; KVar2 != uVar5; uVar5 = uVar5 + 1) {
    poVar4 = std::operator<<(local_1a8,0x30);
    lVar1 = *(long *)poVar4;
    *(undefined8 *)(poVar4 + *(long *)(lVar1 + -0x18) + 0x10) = 2;
    lVar1 = *(long *)(lVar1 + -0x18);
    *(uint *)(poVar4 + lVar1 + 0x18) = *(uint *)(poVar4 + lVar1 + 0x18) & 0xffffffb5 | 8;
    KDataStream::GetBuffer(stream);
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    std::operator<<(poVar4," ");
  }
  std::operator<<(local_1a8,"\n");
  this_00 = (KException *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1d8,"Decode",&local_1f9);
  std::__cxx11::stringbuf::str();
  KException::KException<std::__cxx11::string>(this_00,&local_1d8,2,&local_1f8);
  __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
}

Assistant:

void Header6::Decode(KDataStream &stream, bool ignoreHeader /*= false*/  ) noexcept(false)
{
    if( !ignoreHeader )
    {
        if( stream.GetBufferSize() < HEADER6_PDU_SIZE )
        {
            const KUINT16 bufferSize = stream.GetBufferSize();
            KStringStream ss;
            ss << "Received " << stream.GetBufferSize() << " bytes. Expected minimum " << HEADER6_PDU_SIZE << " bytes.\nData: ";
            for(KUINT16 i = 0; i < bufferSize; i++)
            {
                ss << std::setfill('0') << std::setw(std::numeric_limits<KUOCTET>::digits/4) << std::hex << static_cast<KUINT32>(stream.GetBuffer()[i]) << " ";
            }
            ss << "\n";
            throw KException( __FUNCTION__, NOT_ENOUGH_DATA_IN_BUFFER, ss.str() );
        }

        stream >> m_ui8ProtocolVersion
               >> m_ui8ExerciseID
               >> m_ui8PDUType
               >> m_ui8ProtocolFamily
               >> KDIS_STREAM m_TimeStamp
               >> m_ui16PDULength
               >> m_ui8Padding1
               >> m_ui8Padding2;
    }
}